

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void destroy_context(Context *ctx)

{
  void *d_00;
  MOJOSHADER_free local_28;
  void *d;
  MOJOSHADER_free f;
  Context *ctx_local;
  
  if (ctx != (Context *)0x0) {
    if (ctx->free == (MOJOSHADER_free)0x0) {
      local_28 = MOJOSHADER_internal_free;
    }
    else {
      local_28 = ctx->free;
    }
    d_00 = ctx->malloc_data;
    buffer_destroy(ctx->preflight);
    buffer_destroy(ctx->globals);
    buffer_destroy(ctx->inputs);
    buffer_destroy(ctx->outputs);
    buffer_destroy(ctx->helpers);
    buffer_destroy(ctx->subroutines);
    buffer_destroy(ctx->mainline_intro);
    buffer_destroy(ctx->mainline_arguments);
    buffer_destroy(ctx->mainline_top);
    buffer_destroy(ctx->mainline);
    buffer_destroy(ctx->postflight);
    buffer_destroy(ctx->ignore);
    free_constants_list(local_28,d_00,ctx->constants);
    free_reglist(local_28,d_00,(ctx->used_registers).next);
    free_reglist(local_28,d_00,(ctx->defined_registers).next);
    free_reglist(local_28,d_00,(ctx->uniforms).next);
    free_reglist(local_28,d_00,(ctx->attributes).next);
    free_reglist(local_28,d_00,(ctx->samplers).next);
    free_variable_list(local_28,d_00,ctx->variables);
    errorlist_destroy(ctx->errors);
    free_symbols(local_28,d_00,(ctx->ctab).symbols,(ctx->ctab).symbol_count);
    MOJOSHADER_freePreshader(ctx->preshader);
    (*local_28)(ctx->mainfn,d_00);
    (*local_28)(ctx,d_00);
  }
  return;
}

Assistant:

static void destroy_context(Context *ctx)
{
    if (ctx != NULL)
    {
        MOJOSHADER_free f = ((ctx->free != NULL) ? ctx->free : MOJOSHADER_internal_free);
        void *d = ctx->malloc_data;
        buffer_destroy(ctx->preflight);
        buffer_destroy(ctx->globals);
        buffer_destroy(ctx->inputs);
        buffer_destroy(ctx->outputs);
        buffer_destroy(ctx->helpers);
        buffer_destroy(ctx->subroutines);
        buffer_destroy(ctx->mainline_intro);
        buffer_destroy(ctx->mainline_arguments);
        buffer_destroy(ctx->mainline_top);
        buffer_destroy(ctx->mainline);
        buffer_destroy(ctx->postflight);
        buffer_destroy(ctx->ignore);
        free_constants_list(f, d, ctx->constants);
        free_reglist(f, d, ctx->used_registers.next);
        free_reglist(f, d, ctx->defined_registers.next);
        free_reglist(f, d, ctx->uniforms.next);
        free_reglist(f, d, ctx->attributes.next);
        free_reglist(f, d, ctx->samplers.next);
        free_variable_list(f, d, ctx->variables);
        errorlist_destroy(ctx->errors);
        free_symbols(f, d, ctx->ctab.symbols, ctx->ctab.symbol_count);
        MOJOSHADER_freePreshader(ctx->preshader);
        f((void *) ctx->mainfn, d);
        f(ctx, d);
    } // if
}